

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PduContainer.cpp
# Opt level: O2

int __thiscall DIS::PduContainer::getMarshalledSize(PduContainer *this)

{
  pointer pPVar1;
  int iVar2;
  int iVar3;
  ulong uVar4;
  long lVar5;
  Pdu listElement;
  
  iVar3 = 4;
  lVar5 = 8;
  uVar4 = 0;
  while( true ) {
    pPVar1 = (this->_pdus).super__Vector_base<DIS::Pdu,_std::allocator<DIS::Pdu>_>._M_impl.
             super__Vector_impl_data._M_start;
    if ((ulong)(((long)(this->_pdus).super__Vector_base<DIS::Pdu,_std::allocator<DIS::Pdu>_>._M_impl
                       .super__Vector_impl_data._M_finish - (long)pPVar1) / 0x18) <= uVar4) break;
    listElement._vptr_Pdu = (_func_int **)&PTR__Pdu_001b1ad0;
    listElement._16_4_ = *(undefined4 *)(&pPVar1->_protocolVersion + lVar5);
    listElement._8_8_ = *(undefined8 *)((long)&pPVar1->_vptr_Pdu + lVar5);
    iVar2 = Pdu::getMarshalledSize(&listElement);
    iVar3 = iVar3 + iVar2;
    Pdu::~Pdu(&listElement);
    uVar4 = uVar4 + 1;
    lVar5 = lVar5 + 0x18;
  }
  return iVar3;
}

Assistant:

int PduContainer::getMarshalledSize() const
{
   int marshalSize = 0;

   marshalSize = marshalSize + 4;  // _numberOfPdus

   for(unsigned long long idx=0; idx < _pdus.size(); idx++)
   {
        Pdu listElement = _pdus[idx];
        marshalSize = marshalSize + listElement.getMarshalledSize();
    }

    return marshalSize;
}